

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_id.hpp
# Opt level: O0

type_info boost::python::type_id<unsigned_short>(void)

{
  type_info *in_RAX;
  type_info *unaff_retaddr;
  
  type_info::type_info(unaff_retaddr,in_RAX);
  return (type_info)(base_id_t)in_RAX;
}

Assistant:

inline type_info type_id()
{
    return type_info(
#  if !defined(_MSC_VER)                                       \
      || !BOOST_WORKAROUND(BOOST_INTEL_CXX_VERSION, <= 700)
        typeid(T)
#  else // strip the decoration which Intel mistakenly leaves in
        python::detail::msvc_typeid((boost::type<T>*)0)
#  endif 
        );
}